

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void counting_callback_fn(char *str,void *data)

{
  undefined8 *puVar1;
  
  if (*data != 0x7fffffff) {
    *(int *)data = *data + 1;
    return;
  }
  counting_callback_fn_cold_1();
  puVar1 = (undefined8 *)malloc((long)data + 0x20);
  if (puVar1 == (undefined8 *)0x0) {
    (**(code **)str)("Out of memory",*(undefined8 *)(str + 8));
  }
  else {
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1[2] = 0;
    puVar1[3] = 0;
    *puVar1 = 0x68637461726373;
    puVar1[1] = puVar1 + 4;
    puVar1[3] = data;
  }
  return;
}

Assistant:

static void counting_callback_fn(const char* str, void* data) {
    /* Dummy callback function that just counts. */
    int32_t *p;
    (void)str;
    p = data;
    CHECK(*p != INT32_MAX);
    (*p)++;
}